

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O3

void __thiscall util::logging::Msg::Msg(Msg *this,string *txt,M_Level lvl)

{
  pointer pcVar1;
  
  this->_vptr_Msg = (_func_int **)&PTR__Msg_0011dbb0;
  (this->msg_txt)._M_dataplus._M_p = (pointer)&(this->msg_txt).field_2;
  pcVar1 = (txt->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg_txt,pcVar1,pcVar1 + txt->_M_string_length);
  this->msg_lvl = lvl;
  return;
}

Assistant:

Msg::Msg( const std::string & txt, M_Level lvl ) :
			msg_txt(txt), msg_lvl(lvl)
		{
		}